

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.c++
# Opt level: O2

bool __thiscall kj::_::Mutex::checkPredicate(Mutex *this,Waiter *waiter)

{
  int iVar1;
  undefined1 uVar2;
  NullableValue<kj::Exception> _exception124;
  Disposer *local_4d8;
  char *pcStack_4d0;
  NullableValue<kj::Exception> local_348;
  NullableValue<kj::Exception> local_1a8;
  
  uVar2 = 1;
  if ((waiter->exception).ptr.ptr == (Exception *)0x0) {
    iVar1 = (**waiter->predicate->_vptr_Predicate)();
    uVar2 = (undefined1)iVar1;
    local_348._0_8_ = local_348._0_8_ & 0xffffffffffffff00;
    NullableValue<kj::Exception>::NullableValue(&local_1a8,&local_348);
    NullableValue<kj::Exception>::~NullableValue(&local_348);
    if (local_1a8.isSet == true) {
      heap<kj::Exception>((kj *)&local_4d8,&local_1a8.field_1.value);
      local_348._0_8_ = local_4d8;
      local_348.field_1.value.ownFile.content.ptr = pcStack_4d0;
      pcStack_4d0 = (char *)0x0;
      Own<kj::Exception,_std::nullptr_t>::operator=
                (&(waiter->exception).ptr,(Own<kj::Exception,_std::nullptr_t> *)&local_348);
      if (local_348.field_1.value.ownFile.content.ptr != (char *)0x0) {
        local_348.field_1.value.ownFile.content.ptr = (char *)0x0;
        (***(_func_int ***)local_348._0_8_)();
      }
      if (pcStack_4d0 != (char *)0x0) {
        pcStack_4d0 = (char *)0x0;
        (**local_4d8->_vptr_Disposer)();
      }
      uVar2 = 1;
    }
    NullableValue<kj::Exception>::~NullableValue(&local_1a8);
  }
  return (bool)uVar2;
}

Assistant:

bool Mutex::checkPredicate(Waiter& waiter) {
  // Run the predicate from a thread other than the waiting thread, returning true if it's time to
  // signal the waiting thread. This is not only when the predicate passes, but also when it
  // throws, in which case we want to propagate the exception to the waiting thread.

  if (waiter.exception != kj::none) return true;  // don't run again after an exception

  bool result = false;
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    result = waiter.predicate.check();
  })) {
    // Exception thrown.
    result = true;
    waiter.exception = kj::heap(kj::mv(exception));
  };
  return result;
}